

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AS_DCP_internal.h
# Opt level: O1

void __thiscall
ASDCP::MXF::TrackFileWriter<ASDCP::MXF::OP1aHeader>::AddEssenceDescriptor
          (TrackFileWriter<ASDCP::MXF::OP1aHeader> *this,UL *WrappingUL)

{
  OP1aHeader *pOVar1;
  undefined1 *this_00;
  FileDescriptor *pFVar2;
  long lVar3;
  SourcePackage *pSVar4;
  undefined8 uVar5;
  byte_t *pbVar6;
  _List_node_base *p_Var7;
  UL CryptEssenceUL;
  UL GenericContainerUL;
  UL local_90;
  UL local_70;
  UL local_50;
  
  pFVar2 = this->m_EssenceDescriptor;
  pFVar2[0x110] = (FileDescriptor)(WrappingUL->super_Identifier<16U>).m_HasValue;
  uVar5 = *(undefined8 *)((WrappingUL->super_Identifier<16U>).m_Value + 8);
  *(undefined8 *)(pFVar2 + 0x111) = *(undefined8 *)(WrappingUL->super_Identifier<16U>).m_Value;
  *(undefined8 *)(pFVar2 + 0x119) = uVar5;
  lVar3 = *(long *)&this->field_0x260;
  pSVar4 = this->m_FilePackage;
  *(SourcePackage *)(lVar3 + 0xd0) = pSVar4[0x60];
  uVar5 = *(undefined8 *)(pSVar4 + 0x69);
  *(undefined8 *)(lVar3 + 0xd1) = *(undefined8 *)(pSVar4 + 0x61);
  *(undefined8 *)(lVar3 + 0xd9) = uVar5;
  *(undefined1 *)(lVar3 + 0xe8) = 1;
  if (this->m_Dict != (Dictionary *)0x0) {
    pOVar1 = &this->m_HeaderPart;
    pbVar6 = (byte_t *)ASDCP::Dictionary::Type((MDD_t)this->m_Dict);
    local_50.super_Identifier<16U>.m_HasValue = true;
    local_50.super_Identifier<16U>.m_Value._0_8_ = *(undefined8 *)pbVar6;
    local_50.super_Identifier<16U>.m_Value._8_8_ = *(undefined8 *)(pbVar6 + 8);
    local_50.super_Identifier<16U>.super_IArchive._vptr_IArchive =
         (_func_int **)&PTR__IArchive_0016cc90;
    this_00 = &this->field_0x140;
    std::
    _Rb_tree<ASDCP::UL,ASDCP::UL,std::_Identity<ASDCP::UL>,std::less<ASDCP::UL>,std::allocator<ASDCP::UL>>
    ::_M_insert_unique<ASDCP::UL_const&>
              ((_Rb_tree<ASDCP::UL,ASDCP::UL,std::_Identity<ASDCP::UL>,std::less<ASDCP::UL>,std::allocator<ASDCP::UL>>
                *)this_00,&local_50);
    if ((this->m_Info).EncryptedEssence == true) {
      pbVar6 = (byte_t *)ASDCP::Dictionary::Type((MDD_t)this->m_Dict);
      local_70.super_Identifier<16U>.m_HasValue = true;
      local_70.super_Identifier<16U>.m_Value._0_8_ = *(undefined8 *)pbVar6;
      local_70.super_Identifier<16U>.m_Value._8_8_ = *(undefined8 *)(pbVar6 + 8);
      local_70.super_Identifier<16U>.super_IArchive._vptr_IArchive =
           (_func_int **)&PTR__IArchive_0016cc90;
      std::
      _Rb_tree<ASDCP::UL,ASDCP::UL,std::_Identity<ASDCP::UL>,std::less<ASDCP::UL>,std::allocator<ASDCP::UL>>
      ::_M_insert_unique<ASDCP::UL_const&>
                ((_Rb_tree<ASDCP::UL,ASDCP::UL,std::_Identity<ASDCP::UL>,std::less<ASDCP::UL>,std::allocator<ASDCP::UL>>
                  *)this_00,&local_70);
      lVar3 = *(long *)&this->field_0x260;
      pbVar6 = (byte_t *)ASDCP::Dictionary::Type((MDD_t)this->m_Dict);
      local_90.super_Identifier<16U>.m_HasValue = true;
      local_90.super_Identifier<16U>.m_Value._0_8_ = *(undefined8 *)pbVar6;
      local_90.super_Identifier<16U>.m_Value._8_8_ = *(undefined8 *)(pbVar6 + 8);
      local_90.super_Identifier<16U>.super_IArchive._vptr_IArchive =
           (_func_int **)&PTR__IArchive_0016cc90;
      std::
      _Rb_tree<ASDCP::UL,ASDCP::UL,std::_Identity<ASDCP::UL>,std::less<ASDCP::UL>,std::allocator<ASDCP::UL>>
      ::_M_insert_unique<ASDCP::UL_const&>
                ((_Rb_tree<ASDCP::UL,ASDCP::UL,std::_Identity<ASDCP::UL>,std::less<ASDCP::UL>,std::allocator<ASDCP::UL>>
                  *)(lVar3 + 0x198),&local_90);
      ASDCP::AddDmsCrypt((Partition *)pOVar1,this->m_FilePackage,&this->m_Info,WrappingUL,
                         this->m_Dict);
    }
    else {
      std::
      _Rb_tree<ASDCP::UL,ASDCP::UL,std::_Identity<ASDCP::UL>,std::less<ASDCP::UL>,std::allocator<ASDCP::UL>>
      ::_M_insert_unique<ASDCP::UL_const&>
                ((_Rb_tree<ASDCP::UL,ASDCP::UL,std::_Identity<ASDCP::UL>,std::less<ASDCP::UL>,std::allocator<ASDCP::UL>>
                  *)this_00,WrappingUL);
    }
    std::
    _Rb_tree<ASDCP::UL,_ASDCP::UL,_std::_Identity<ASDCP::UL>,_std::less<ASDCP::UL>,_std::allocator<ASDCP::UL>_>
    ::operator=((_Rb_tree<ASDCP::UL,_ASDCP::UL,_std::_Identity<ASDCP::UL>,_std::less<ASDCP::UL>,_std::allocator<ASDCP::UL>_>
                 *)(*(long *)&this->field_0x260 + 0x158),
                (_Rb_tree<ASDCP::UL,_ASDCP::UL,_std::_Identity<ASDCP::UL>,_std::less<ASDCP::UL>,_std::allocator<ASDCP::UL>_>
                 *)this_00);
    ASDCP::MXF::Partition::AddChildObject((InterchangeObject *)pOVar1);
    for (p_Var7 = (this->m_EssenceSubDescriptorList).
                  super__List_base<ASDCP::MXF::InterchangeObject_*,_std::allocator<ASDCP::MXF::InterchangeObject_*>_>
                  ._M_impl._M_node.super__List_node_base._M_next;
        p_Var7 != (_List_node_base *)&this->m_EssenceSubDescriptorList; p_Var7 = p_Var7->_M_next) {
      ASDCP::MXF::Partition::AddChildObject((InterchangeObject *)pOVar1);
    }
    pSVar4 = this->m_FilePackage;
    pFVar2 = this->m_EssenceDescriptor;
    pSVar4[0x158] = *(SourcePackage *)(pFVar2 + 0x60);
    uVar5 = *(undefined8 *)(pFVar2 + 0x69);
    *(undefined8 *)(pSVar4 + 0x159) = *(undefined8 *)(pFVar2 + 0x61);
    *(undefined8 *)(pSVar4 + 0x161) = uVar5;
    return;
  }
  __assert_fail("m_Dict",
                "/workspace/llm4binary/github/license_c_cmakelists/cinecert[P]asdcplib/src/AS_DCP_internal.h"
                ,0x340,
                "void ASDCP::MXF::TrackFileWriter<ASDCP::MXF::OP1aHeader>::AddEssenceDescriptor(const UL &) [HeaderType = ASDCP::MXF::OP1aHeader]"
               );
}

Assistant:

void AddEssenceDescriptor(const UL& WrappingUL)
	{
	  //
	  // Essence Descriptor
	  //
	  m_EssenceDescriptor->EssenceContainer = WrappingUL;
	  m_HeaderPart.m_Preface->PrimaryPackage = m_FilePackage->InstanceUID;

	  //
	  // Essence Descriptors
	  //
	  assert(m_Dict);
#ifndef ASDCP_GCMULTI_PATCH
	  UL GenericContainerUL(m_Dict->ul(MDD_GCMulti));
	  m_HeaderPart.EssenceContainers.push_back(GenericContainerUL);
#endif

	  if ( m_Info.EncryptedEssence )
	    {
	      UL CryptEssenceUL(m_Dict->ul(MDD_EncryptedContainerLabel));
	      m_HeaderPart.EssenceContainers.push_back(CryptEssenceUL);
	      m_HeaderPart.m_Preface->DMSchemes.push_back(UL(m_Dict->ul(MDD_CryptographicFrameworkLabel)));
	      AddDmsCrypt(m_HeaderPart, *m_FilePackage, m_Info, WrappingUL, m_Dict);
	      //// TODO: fix DMSegment Duration value
	    }
	  else
	    {
	      m_HeaderPart.EssenceContainers.push_back(WrappingUL);
	    }

	  m_HeaderPart.m_Preface->EssenceContainers = m_HeaderPart.EssenceContainers;
	  m_HeaderPart.AddChildObject(m_EssenceDescriptor);

	  std::list<InterchangeObject*>::iterator sdli = m_EssenceSubDescriptorList.begin();
	  for ( ; sdli != m_EssenceSubDescriptorList.end(); sdli++ )
	    m_HeaderPart.AddChildObject(*sdli);

	  m_FilePackage->Descriptor = m_EssenceDescriptor->InstanceUID;
	}